

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

string * __thiscall IPAddress::GetString_abi_cxx11_(string *__return_storage_ptr__,IPAddress *this)

{
  allocator<char> local_2d;
  byte local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  char local_28 [4];
  uchar o4;
  uchar o3;
  uchar o2;
  uchar o1;
  char buf [16];
  IPAddress *this_local;
  
  local_29 = *(byte *)((long)&this->address + 3);
  local_2a = *(byte *)((long)&this->address + 2);
  local_2b = *(byte *)((long)&this->address + 1);
  local_2c = (byte)this->address;
  buf._8_8_ = this;
  sprintf(local_28,"%u.%u.%u.%u",(ulong)local_29,(ulong)local_2a,(ulong)local_2b,(ulong)local_2c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_28,&local_2d);
  std::allocator<char>::~allocator(&local_2d);
  return __return_storage_ptr__;
}

Assistant:

std::string IPAddress::GetString() const
{
	char buf[16];
	unsigned char o1, o2, o3, o4;
	o1 = (this->address & 0xFF000000) >> 24;
	o2 = (this->address & 0x00FF0000) >> 16;
	o3 = (this->address & 0x0000FF00) >> 8;
	o4 = this->address & 0x000000FF;
	std::sprintf(buf, "%u.%u.%u.%u", o1, o2, o3, o4);
	return std::string(buf);
}